

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase272::run(TestCase272 *this)

{
  undefined2 uVar1;
  ReaderFor<bool> RVar2;
  BuilderFor<bool> BVar3;
  int32_t iVar4;
  int64_t iVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  SegmentBuilder *pSVar9;
  bool bVar10;
  Reader RVar11;
  ReaderFor<Text> RVar12;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StringPtr name_11;
  StringPtr name_12;
  StringPtr name_13;
  StringPtr name_14;
  StringPtr name_15;
  StringPtr name_16;
  StringPtr name_17;
  StringPtr name_18;
  StringPtr name_19;
  StringPtr name_20;
  ReaderFor<capnp::DynamicStruct> u;
  Builder root;
  ReaderFor<DynamicTypeFor<FromReader<Reader>_>_> dynamic;
  MallocMessageBuilder builder;
  Reader local_228;
  ArrayPtr<const_char> local_1e0;
  long local_1d0;
  ReaderFor<DynamicStruct> local_1c8;
  int64_t local_190;
  StructBuilder local_188;
  undefined1 local_158 [48];
  byte *pbStack_128;
  MallocMessageBuilder local_120;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)local_158,&local_120.super_MessageBuilder);
  local_228.field_1.textValue.super_StringPtr.content.size_ = local_158._16_8_;
  local_228._0_8_ = local_158._0_8_;
  local_228.field_1.intValue = local_158._8_8_;
  PointerBuilder::initStruct(&local_188,(PointerBuilder *)&local_228,(StructSize)0x20008);
  *(undefined2 *)local_188.data = 0xb;
  *(undefined4 *)((long)local_188.data + 8) = 0x12d687;
  local_228.field_1.anyPointerValue.reader.capTable = (CapTableReader *)(local_188.pointers + 1);
  *(undefined2 *)((long)local_188.data + 2) = 0xc;
  local_228._0_8_ = local_188.segment;
  local_228.field_1.intValue = (int64_t)local_188.capTable;
  RVar11.super_StringPtr.content.size_ = 4;
  RVar11.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_228,RVar11);
  *(undefined2 *)((long)local_188.data + 4) = 0;
  *(byte *)((long)local_188.data + 0x20) = *(byte *)((long)local_188.data + 0x20) | 1;
  *(undefined2 *)((long)local_188.data + 6) = 4;
  *(undefined8 *)((long)local_188.data + 0x38) = 0x112210f47de98115;
  StructBuilder::asReader(&local_188);
  local_158._40_8_ = local_228.field_1.listValue.reader.capTable;
  pbStack_128 = local_228.field_1.listValue.reader.ptr;
  local_158._24_8_ = local_228.field_1.textValue.super_StringPtr.content.size_;
  local_158._8_8_ = local_228._0_8_;
  local_158._16_8_ = local_228.field_1.intValue;
  local_158._0_8_ = (long)schemas::s_f47697362233ce52 + 0x48;
  name.content.size_ = 7;
  name.content.ptr = "union0";
  DynamicStruct::Reader::get(&local_228,(Reader *)local_158,name);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_1c8,&local_228);
  DynamicValue::Reader::~Reader(&local_228);
  DynamicStruct::Reader::which((Maybe<capnp::StructSchema::Field> *)&local_228,&local_1c8);
  uVar7 = local_228.field_1.listValue.reader.nestingLimit;
  uVar1 = local_228.field_1.listValue.reader.structPointerCount;
  uVar8 = local_228.field_1._40_8_;
  uVar6 = local_228.field_1.listValue.reader.capTable;
  if ((bool)(undefined1)local_228.type == true) {
    pSVar9 = (SegmentBuilder *)CONCAT44(local_228.field_1._20_4_,local_228.field_1._16_4_);
    local_228.field_1.listValue.schema.elementType._0_8_ =
         local_228.field_1.listValue.reader.capTable;
    local_228.field_1._8_8_ = local_228.field_1._40_8_;
    local_228._0_8_ = pSVar9;
    local_228.field_1.listValue.reader.segment._0_4_ =
         local_228.field_1.listValue.reader.nestingLimit;
    if (local_228.field_1.listValue.reader.structPointerCount == 0) {
      local_228.field_1.intValue = (int64_t)(WirePointer *)0x0;
      local_228.field_1.textValue.super_StringPtr.content.size_ = (size_t)(WirePointer *)0x0;
      local_228._0_8_ = (SegmentBuilder *)0x0;
      local_228.field_1._16_4_ = 0x7fffffff;
    }
    RVar11 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_228,(void *)0x0,0);
    if (((RVar11.super_StringPtr.content.size_ != 8) ||
        (*(int *)((long)RVar11.super_StringPtr.content.ptr + 3) != 0x32337331 ||
         *RVar11.super_StringPtr.content.ptr != 0x31663075)) && (kj::_::Debug::minSeverity < 3)) {
      if (uVar1 == 0) {
        uVar6 = (WirePointer *)0x0;
        uVar7 = 0x7fffffff;
        uVar8 = (WirePointer *)0x0;
        pSVar9 = (SegmentBuilder *)0x0;
      }
      local_228._0_8_ = pSVar9;
      local_228.field_1.intValue = uVar6;
      local_228.field_1.textValue.super_StringPtr.content.size_ = uVar8;
      local_228.field_1._16_4_ = uVar7;
      local_1e0 = (ArrayPtr<const_char>)
                  PointerReader::getBlob<capnp::Text>((PointerReader *)&local_228,(void *)0x0,0);
      kj::_::Debug::log<char_const(&)[58],char_const(&)[8],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x11d,ERROR,
                 "\"failed: expected \" \"(\\\"u0f1s32\\\") == (w->getProto().getName())\", \"u0f1s32\", w->getProto().getName()"
                 ,(char (*) [58])"failed: expected (\"u0f1s32\") == (w->getProto().getName())",
                 (char (*) [8])"u0f1s32",(Reader *)&local_1e0);
    }
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[17]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x11d,ERROR,"\"Maybe was empty.\"",(char (*) [17])"Maybe was empty.");
  }
  name_00.content.size_ = 8;
  name_00.content.ptr = "u0f1s32";
  DynamicStruct::Reader::get(&local_228,&local_1c8,name_00);
  iVar4 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply(&local_228);
  DynamicValue::Reader::~Reader(&local_228);
  if ((iVar4 != 0x12d687) && (kj::_::Debug::minSeverity < 3)) {
    local_1e0.ptr._0_4_ = 0x12d687;
    name_01.content.size_ = 8;
    name_01.content.ptr = "u0f1s32";
    DynamicStruct::Reader::get(&local_228,&local_1c8,name_01);
    iVar4 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply(&local_228);
    local_190 = CONCAT44(local_190._4_4_,iVar4);
    kj::_::Debug::log<char_const(&)[63],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x11e,ERROR,
               "\"failed: expected \" \"(1234567) == (u.get(\\\"u0f1s32\\\").as<int32_t>())\", 1234567, u.get(\"u0f1s32\").as<int32_t>()"
               ,(char (*) [63])"failed: expected (1234567) == (u.get(\"u0f1s32\").as<int32_t>())",
               (int *)&local_1e0,(int *)&local_190);
    DynamicValue::Reader::~Reader(&local_228);
  }
  name_02.content.size_ = 7;
  name_02.content.ptr = "union1";
  DynamicStruct::Reader::get(&local_228,(Reader *)local_158,name_02);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_1c8,&local_228);
  DynamicValue::Reader::~Reader(&local_228);
  DynamicStruct::Reader::which((Maybe<capnp::StructSchema::Field> *)&local_228,&local_1c8);
  uVar7 = local_228.field_1.listValue.reader.nestingLimit;
  uVar1 = local_228.field_1.listValue.reader.structPointerCount;
  uVar8 = local_228.field_1._40_8_;
  uVar6 = local_228.field_1.listValue.reader.capTable;
  if ((bool)(undefined1)local_228.type == true) {
    pSVar9 = (SegmentBuilder *)CONCAT44(local_228.field_1._20_4_,local_228.field_1._16_4_);
    local_228.field_1.listValue.schema.elementType._0_8_ =
         local_228.field_1.listValue.reader.capTable;
    local_228.field_1._8_8_ = local_228.field_1._40_8_;
    local_228._0_8_ = pSVar9;
    local_228.field_1.listValue.reader.segment._0_4_ =
         local_228.field_1.listValue.reader.nestingLimit;
    if (local_228.field_1.listValue.reader.structPointerCount == 0) {
      local_228.field_1.intValue = (int64_t)(WirePointer *)0x0;
      local_228.field_1.textValue.super_StringPtr.content.size_ = (size_t)(WirePointer *)0x0;
      local_228._0_8_ = (SegmentBuilder *)0x0;
      local_228.field_1._16_4_ = 0x7fffffff;
    }
    RVar11 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_228,(void *)0x0,0);
    if (((RVar11.super_StringPtr.content.size_ != 7) ||
        ((short)RVar11.super_StringPtr.content.ptr[1] != 0x7073 ||
         *RVar11.super_StringPtr.content.ptr != 0x31663175)) && (kj::_::Debug::minSeverity < 3)) {
      if (uVar1 == 0) {
        uVar6 = (WirePointer *)0x0;
        uVar7 = 0x7fffffff;
        uVar8 = (WirePointer *)0x0;
        pSVar9 = (SegmentBuilder *)0x0;
      }
      local_228._0_8_ = pSVar9;
      local_228.field_1.intValue = uVar6;
      local_228.field_1.textValue.super_StringPtr.content.size_ = uVar8;
      local_228.field_1._16_4_ = uVar7;
      local_1e0 = (ArrayPtr<const_char>)
                  PointerReader::getBlob<capnp::Text>((PointerReader *)&local_228,(void *)0x0,0);
      kj::_::Debug::log<char_const(&)[57],char_const(&)[7],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x122,ERROR,
                 "\"failed: expected \" \"(\\\"u1f1sp\\\") == (w->getProto().getName())\", \"u1f1sp\", w->getProto().getName()"
                 ,(char (*) [57])"failed: expected (\"u1f1sp\") == (w->getProto().getName())",
                 (char (*) [7])"u1f1sp",(Reader *)&local_1e0);
    }
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[17]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x122,ERROR,"\"Maybe was empty.\"",(char (*) [17])"Maybe was empty.");
  }
  name_03.content.size_ = 7;
  name_03.content.ptr = "u1f1sp";
  DynamicStruct::Reader::get(&local_228,&local_1c8,name_03);
  RVar12 = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply(&local_228);
  bVar10 = true;
  if (RVar12.super_StringPtr.content.size_ == 4) {
    bVar10 = (char)RVar12.super_StringPtr.content.ptr[1] != 'o' ||
             *RVar12.super_StringPtr.content.ptr != 0x6f66;
  }
  DynamicValue::Reader::~Reader(&local_228);
  if ((bool)(bVar10 & kj::_::Debug::minSeverity < 3)) {
    name_04.content.size_ = 7;
    name_04.content.ptr = "u1f1sp";
    DynamicStruct::Reader::get(&local_228,&local_1c8,name_04);
    local_1e0 = (ArrayPtr<const_char>)
                DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply(&local_228);
    kj::_::Debug::log<char_const(&)[57],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x123,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (u.get(\\\"u1f1sp\\\").as<Text>())\", \"foo\", u.get(\"u1f1sp\").as<Text>()"
               ,(char (*) [57])"failed: expected (\"foo\") == (u.get(\"u1f1sp\").as<Text>())",
               (char (*) [4])0x4da3ec,(Reader *)&local_1e0);
    DynamicValue::Reader::~Reader(&local_228);
  }
  name_05.content.size_ = 7;
  name_05.content.ptr = "union2";
  DynamicStruct::Reader::get(&local_228,(Reader *)local_158,name_05);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_1c8,&local_228);
  DynamicValue::Reader::~Reader(&local_228);
  DynamicStruct::Reader::which((Maybe<capnp::StructSchema::Field> *)&local_228,&local_1c8);
  uVar7 = local_228.field_1.listValue.reader.nestingLimit;
  uVar1 = local_228.field_1.listValue.reader.structPointerCount;
  uVar8 = local_228.field_1._40_8_;
  uVar6 = local_228.field_1.listValue.reader.capTable;
  if ((bool)(undefined1)local_228.type == true) {
    pSVar9 = (SegmentBuilder *)CONCAT44(local_228.field_1._20_4_,local_228.field_1._16_4_);
    local_228.field_1.listValue.schema.elementType._0_8_ =
         local_228.field_1.listValue.reader.capTable;
    local_228.field_1._8_8_ = local_228.field_1._40_8_;
    local_228._0_8_ = pSVar9;
    local_228.field_1.listValue.reader.segment._0_4_ =
         local_228.field_1.listValue.reader.nestingLimit;
    if (local_228.field_1.listValue.reader.structPointerCount == 0) {
      local_228.field_1.intValue = (int64_t)(WirePointer *)0x0;
      local_228.field_1.textValue.super_StringPtr.content.size_ = (size_t)(WirePointer *)0x0;
      local_228._0_8_ = (SegmentBuilder *)0x0;
      local_228.field_1._16_4_ = 0x7fffffff;
    }
    RVar11 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_228,(void *)0x0,0);
    if (((RVar11.super_StringPtr.content.size_ != 7) ||
        ((short)RVar11.super_StringPtr.content.ptr[1] != 0x3173 ||
         *RVar11.super_StringPtr.content.ptr != 0x30663275)) && (kj::_::Debug::minSeverity < 3)) {
      if (uVar1 == 0) {
        uVar6 = (WirePointer *)0x0;
        uVar7 = 0x7fffffff;
        uVar8 = (WirePointer *)0x0;
        pSVar9 = (SegmentBuilder *)0x0;
      }
      local_228._0_8_ = pSVar9;
      local_228.field_1.intValue = uVar6;
      local_228.field_1.textValue.super_StringPtr.content.size_ = uVar8;
      local_228.field_1._16_4_ = uVar7;
      local_1e0 = (ArrayPtr<const_char>)
                  PointerReader::getBlob<capnp::Text>((PointerReader *)&local_228,(void *)0x0,0);
      kj::_::Debug::log<char_const(&)[57],char_const(&)[7],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x127,ERROR,
                 "\"failed: expected \" \"(\\\"u2f0s1\\\") == (w->getProto().getName())\", \"u2f0s1\", w->getProto().getName()"
                 ,(char (*) [57])"failed: expected (\"u2f0s1\") == (w->getProto().getName())",
                 (char (*) [7])"u2f0s1",(Reader *)&local_1e0);
    }
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[17]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x127,ERROR,"\"Maybe was empty.\"",(char (*) [17])"Maybe was empty.");
  }
  name_06.content.size_ = 7;
  name_06.content.ptr = "u2f0s1";
  DynamicStruct::Reader::get(&local_228,&local_1c8,name_06);
  RVar2 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply(&local_228);
  DynamicValue::Reader::~Reader(&local_228);
  if (!RVar2 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[44]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x128,ERROR,"\"failed: expected \" \"u.get(\\\"u2f0s1\\\").as<bool>()\"",
               (char (*) [44])"failed: expected u.get(\"u2f0s1\").as<bool>()");
  }
  name_07.content.size_ = 7;
  name_07.content.ptr = "union3";
  DynamicStruct::Reader::get(&local_228,(Reader *)local_158,name_07);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_1c8,&local_228);
  DynamicValue::Reader::~Reader(&local_228);
  DynamicStruct::Reader::which((Maybe<capnp::StructSchema::Field> *)&local_228,&local_1c8);
  uVar7 = local_228.field_1.listValue.reader.nestingLimit;
  uVar1 = local_228.field_1.listValue.reader.structPointerCount;
  uVar8 = local_228.field_1._40_8_;
  uVar6 = local_228.field_1.listValue.reader.capTable;
  if ((bool)(undefined1)local_228.type == true) {
    pSVar9 = (SegmentBuilder *)CONCAT44(local_228.field_1._20_4_,local_228.field_1._16_4_);
    local_228.field_1.listValue.schema.elementType._0_8_ =
         local_228.field_1.listValue.reader.capTable;
    local_228.field_1._8_8_ = local_228.field_1._40_8_;
    local_228._0_8_ = pSVar9;
    local_228.field_1.listValue.reader.segment._0_4_ =
         local_228.field_1.listValue.reader.nestingLimit;
    if (local_228.field_1.listValue.reader.structPointerCount == 0) {
      local_228.field_1.intValue = (int64_t)(WirePointer *)0x0;
      local_228.field_1.textValue.super_StringPtr.content.size_ = (size_t)(WirePointer *)0x0;
      local_228._0_8_ = (SegmentBuilder *)0x0;
      local_228.field_1._16_4_ = 0x7fffffff;
    }
    RVar11 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_228,(void *)0x0,0);
    if (((RVar11.super_StringPtr.content.size_ != 8) ||
        (*(int *)((long)RVar11.super_StringPtr.content.ptr + 3) != 0x34367330 ||
         *RVar11.super_StringPtr.content.ptr != 0x30663375)) && (kj::_::Debug::minSeverity < 3)) {
      if (uVar1 == 0) {
        uVar6 = (WirePointer *)0x0;
        uVar7 = 0x7fffffff;
        uVar8 = (WirePointer *)0x0;
        pSVar9 = (SegmentBuilder *)0x0;
      }
      local_228._0_8_ = pSVar9;
      local_228.field_1.intValue = uVar6;
      local_228.field_1.textValue.super_StringPtr.content.size_ = uVar8;
      local_228.field_1._16_4_ = uVar7;
      local_1e0 = (ArrayPtr<const_char>)
                  PointerReader::getBlob<capnp::Text>((PointerReader *)&local_228,(void *)0x0,0);
      kj::_::Debug::log<char_const(&)[58],char_const(&)[8],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,300,ERROR,
                 "\"failed: expected \" \"(\\\"u3f0s64\\\") == (w->getProto().getName())\", \"u3f0s64\", w->getProto().getName()"
                 ,(char (*) [58])"failed: expected (\"u3f0s64\") == (w->getProto().getName())",
                 (char (*) [8])"u3f0s64",(Reader *)&local_1e0);
    }
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[17]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,300,ERROR,"\"Maybe was empty.\"",(char (*) [17])"Maybe was empty.");
  }
  name_08.content.size_ = 8;
  name_08.content.ptr = "u3f0s64";
  DynamicStruct::Reader::get(&local_228,&local_1c8,name_08);
  iVar5 = DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply(&local_228);
  DynamicValue::Reader::~Reader(&local_228);
  if ((iVar5 != 0x112210f47de98115) && (kj::_::Debug::minSeverity < 3)) {
    local_1e0.ptr = (char *)0x112210f47de98115;
    name_09.content.size_ = 8;
    name_09.content.ptr = "u3f0s64";
    DynamicStruct::Reader::get(&local_228,&local_1c8,name_09);
    local_190 = DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply(&local_228);
    kj::_::Debug::log<char_const(&)[77],long_long,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x12d,ERROR,
               "\"failed: expected \" \"(1234567890123456789ll) == (u.get(\\\"u3f0s64\\\").as<int64_t>())\", 1234567890123456789ll, u.get(\"u3f0s64\").as<int64_t>()"
               ,(char (*) [77])
                "failed: expected (1234567890123456789ll) == (u.get(\"u3f0s64\").as<int64_t>())",
               (longlong *)&local_1e0,&local_190);
    DynamicValue::Reader::~Reader(&local_228);
  }
  local_158._40_4_ = local_188.dataSize;
  local_158._44_2_ = local_188.pointerCount;
  local_158._46_2_ = local_188._38_2_;
  local_158._24_8_ = local_188.data;
  local_158._32_8_ = local_188.pointers;
  local_158._8_8_ = local_188.segment;
  local_158._16_8_ = local_188.capTable;
  local_158._0_8_ = (long)schemas::s_f47697362233ce52 + 0x48;
  name_10.content.size_ = 7;
  name_10.content.ptr = "union0";
  DynamicStruct::Builder::get((Builder *)&local_228,(Builder *)local_158,name_10);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&local_1c8,(Builder *)&local_228);
  DynamicValue::Builder::~Builder((Builder *)&local_228);
  DynamicStruct::Builder::which
            ((Maybe<capnp::StructSchema::Field> *)&local_228,(Builder *)&local_1c8);
  uVar7 = local_228.field_1.listValue.reader.nestingLimit;
  uVar1 = local_228.field_1.listValue.reader.structPointerCount;
  uVar8 = local_228.field_1._40_8_;
  uVar6 = local_228.field_1.listValue.reader.capTable;
  if ((bool)(undefined1)local_228.type == true) {
    pSVar9 = (SegmentBuilder *)CONCAT44(local_228.field_1._20_4_,local_228.field_1._16_4_);
    local_228.field_1.listValue.schema.elementType._0_8_ =
         local_228.field_1.listValue.reader.capTable;
    local_228.field_1._8_8_ = local_228.field_1._40_8_;
    local_228._0_8_ = pSVar9;
    local_228.field_1.listValue.reader.segment._0_4_ =
         local_228.field_1.listValue.reader.nestingLimit;
    if (local_228.field_1.listValue.reader.structPointerCount == 0) {
      local_228.field_1.intValue = (int64_t)(WirePointer *)0x0;
      local_228.field_1.textValue.super_StringPtr.content.size_ = (size_t)(WirePointer *)0x0;
      local_228._0_8_ = (SegmentBuilder *)0x0;
      local_228.field_1._16_4_ = 0x7fffffff;
    }
    RVar11 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_228,(void *)0x0,0);
    if (((RVar11.super_StringPtr.content.size_ != 8) ||
        (*(int *)((long)RVar11.super_StringPtr.content.ptr + 3) != 0x32337331 ||
         *RVar11.super_StringPtr.content.ptr != 0x31663075)) && (kj::_::Debug::minSeverity < 3)) {
      if (uVar1 == 0) {
        uVar6 = (WirePointer *)0x0;
        uVar7 = 0x7fffffff;
        uVar8 = (WirePointer *)0x0;
        pSVar9 = (SegmentBuilder *)0x0;
      }
      local_228._0_8_ = pSVar9;
      local_228.field_1.intValue = uVar6;
      local_228.field_1.textValue.super_StringPtr.content.size_ = uVar8;
      local_228.field_1._16_4_ = uVar7;
      local_1e0 = (ArrayPtr<const_char>)
                  PointerReader::getBlob<capnp::Text>((PointerReader *)&local_228,(void *)0x0,0);
      kj::_::Debug::log<char_const(&)[58],char_const(&)[8],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x136,ERROR,
                 "\"failed: expected \" \"(\\\"u0f1s32\\\") == (w->getProto().getName())\", \"u0f1s32\", w->getProto().getName()"
                 ,(char (*) [58])"failed: expected (\"u0f1s32\") == (w->getProto().getName())",
                 (char (*) [8])"u0f1s32",(Reader *)&local_1e0);
    }
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[17]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x136,ERROR,"\"Maybe was empty.\"",(char (*) [17])"Maybe was empty.");
  }
  name_11.content.size_ = 8;
  name_11.content.ptr = "u0f1s32";
  DynamicStruct::Builder::get((Builder *)&local_228,(Builder *)&local_1c8,name_11);
  iVar4 = DynamicValue::Builder::AsImpl<int,_(capnp::Kind)0>::apply((Builder *)&local_228);
  DynamicValue::Builder::~Builder((Builder *)&local_228);
  if ((iVar4 != 0x12d687) && (kj::_::Debug::minSeverity < 3)) {
    local_1e0.ptr._0_4_ = 0x12d687;
    name_12.content.size_ = 8;
    name_12.content.ptr = "u0f1s32";
    DynamicStruct::Builder::get((Builder *)&local_228,(Builder *)&local_1c8,name_12);
    iVar4 = DynamicValue::Builder::AsImpl<int,_(capnp::Kind)0>::apply((Builder *)&local_228);
    local_190 = CONCAT44(local_190._4_4_,iVar4);
    kj::_::Debug::log<char_const(&)[63],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x137,ERROR,
               "\"failed: expected \" \"(1234567) == (u.get(\\\"u0f1s32\\\").as<int32_t>())\", 1234567, u.get(\"u0f1s32\").as<int32_t>()"
               ,(char (*) [63])"failed: expected (1234567) == (u.get(\"u0f1s32\").as<int32_t>())",
               (int *)&local_1e0,(int *)&local_190);
    DynamicValue::Builder::~Builder((Builder *)&local_228);
  }
  name_13.content.size_ = 7;
  name_13.content.ptr = "union1";
  DynamicStruct::Builder::get((Builder *)&local_228,(Builder *)local_158,name_13);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&local_1c8,(Builder *)&local_228);
  DynamicValue::Builder::~Builder((Builder *)&local_228);
  DynamicStruct::Builder::which
            ((Maybe<capnp::StructSchema::Field> *)&local_228,(Builder *)&local_1c8);
  uVar7 = local_228.field_1.listValue.reader.nestingLimit;
  uVar1 = local_228.field_1.listValue.reader.structPointerCount;
  uVar8 = local_228.field_1._40_8_;
  uVar6 = local_228.field_1.listValue.reader.capTable;
  if ((bool)(undefined1)local_228.type == true) {
    pSVar9 = (SegmentBuilder *)CONCAT44(local_228.field_1._20_4_,local_228.field_1._16_4_);
    local_228.field_1.listValue.schema.elementType._0_8_ =
         local_228.field_1.listValue.reader.capTable;
    local_228.field_1._8_8_ = local_228.field_1._40_8_;
    local_228._0_8_ = pSVar9;
    local_228.field_1.listValue.reader.segment._0_4_ =
         local_228.field_1.listValue.reader.nestingLimit;
    if (local_228.field_1.listValue.reader.structPointerCount == 0) {
      local_228.field_1.intValue = (int64_t)(WirePointer *)0x0;
      local_228.field_1.textValue.super_StringPtr.content.size_ = (size_t)(WirePointer *)0x0;
      local_228._0_8_ = (SegmentBuilder *)0x0;
      local_228.field_1._16_4_ = 0x7fffffff;
    }
    RVar11 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_228,(void *)0x0,0);
    if (((RVar11.super_StringPtr.content.size_ != 7) ||
        ((short)RVar11.super_StringPtr.content.ptr[1] != 0x7073 ||
         *RVar11.super_StringPtr.content.ptr != 0x31663175)) && (kj::_::Debug::minSeverity < 3)) {
      if (uVar1 == 0) {
        uVar6 = (WirePointer *)0x0;
        uVar7 = 0x7fffffff;
        uVar8 = (WirePointer *)0x0;
        pSVar9 = (SegmentBuilder *)0x0;
      }
      local_228._0_8_ = pSVar9;
      local_228.field_1.intValue = uVar6;
      local_228.field_1.textValue.super_StringPtr.content.size_ = uVar8;
      local_228.field_1._16_4_ = uVar7;
      local_1e0 = (ArrayPtr<const_char>)
                  PointerReader::getBlob<capnp::Text>((PointerReader *)&local_228,(void *)0x0,0);
      kj::_::Debug::log<char_const(&)[57],char_const(&)[7],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x13b,ERROR,
                 "\"failed: expected \" \"(\\\"u1f1sp\\\") == (w->getProto().getName())\", \"u1f1sp\", w->getProto().getName()"
                 ,(char (*) [57])"failed: expected (\"u1f1sp\") == (w->getProto().getName())",
                 (char (*) [7])"u1f1sp",(Reader *)&local_1e0);
    }
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[17]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x13b,ERROR,"\"Maybe was empty.\"",(char (*) [17])"Maybe was empty.");
  }
  name_14.content.size_ = 7;
  name_14.content.ptr = "u1f1sp";
  DynamicStruct::Builder::get((Builder *)&local_228,(Builder *)&local_1c8,name_14);
  DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
            ((BuilderFor<Text> *)&local_1e0,(Builder *)&local_228);
  bVar10 = true;
  if (local_1d0 == 4) {
    bVar10 = (char)*(short *)(local_1e0.size_ + 2) != 'o' || *(short *)local_1e0.size_ != 0x6f66;
  }
  DynamicValue::Builder::~Builder((Builder *)&local_228);
  if ((bool)(bVar10 & kj::_::Debug::minSeverity < 3)) {
    name_15.content.size_ = 7;
    name_15.content.ptr = "u1f1sp";
    DynamicStruct::Builder::get((Builder *)&local_228,(Builder *)&local_1c8,name_15);
    DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
              ((BuilderFor<Text> *)&local_1e0,(Builder *)&local_228);
    kj::_::Debug::log<char_const(&)[57],char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x13c,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (u.get(\\\"u1f1sp\\\").as<Text>())\", \"foo\", u.get(\"u1f1sp\").as<Text>()"
               ,(char (*) [57])"failed: expected (\"foo\") == (u.get(\"u1f1sp\").as<Text>())",
               (char (*) [4])0x4da3ec,(Builder *)&local_1e0);
    DynamicValue::Builder::~Builder((Builder *)&local_228);
  }
  name_16.content.size_ = 7;
  name_16.content.ptr = "union2";
  DynamicStruct::Builder::get((Builder *)&local_228,(Builder *)local_158,name_16);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&local_1c8,(Builder *)&local_228);
  DynamicValue::Builder::~Builder((Builder *)&local_228);
  DynamicStruct::Builder::which
            ((Maybe<capnp::StructSchema::Field> *)&local_228,(Builder *)&local_1c8);
  uVar7 = local_228.field_1.listValue.reader.nestingLimit;
  uVar1 = local_228.field_1.listValue.reader.structPointerCount;
  uVar8 = local_228.field_1._40_8_;
  uVar6 = local_228.field_1.listValue.reader.capTable;
  if ((bool)(undefined1)local_228.type == true) {
    pSVar9 = (SegmentBuilder *)CONCAT44(local_228.field_1._20_4_,local_228.field_1._16_4_);
    local_228.field_1.listValue.schema.elementType._0_8_ =
         local_228.field_1.listValue.reader.capTable;
    local_228.field_1._8_8_ = local_228.field_1._40_8_;
    local_228._0_8_ = pSVar9;
    local_228.field_1.listValue.reader.segment._0_4_ =
         local_228.field_1.listValue.reader.nestingLimit;
    if (local_228.field_1.listValue.reader.structPointerCount == 0) {
      local_228.field_1.intValue = (int64_t)(WirePointer *)0x0;
      local_228.field_1.textValue.super_StringPtr.content.size_ = (size_t)(WirePointer *)0x0;
      local_228._0_8_ = (SegmentBuilder *)0x0;
      local_228.field_1._16_4_ = 0x7fffffff;
    }
    RVar11 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_228,(void *)0x0,0);
    if (((RVar11.super_StringPtr.content.size_ != 7) ||
        ((short)RVar11.super_StringPtr.content.ptr[1] != 0x3173 ||
         *RVar11.super_StringPtr.content.ptr != 0x30663275)) && (kj::_::Debug::minSeverity < 3)) {
      if (uVar1 == 0) {
        uVar6 = (WirePointer *)0x0;
        uVar7 = 0x7fffffff;
        uVar8 = (WirePointer *)0x0;
        pSVar9 = (SegmentBuilder *)0x0;
      }
      local_228._0_8_ = pSVar9;
      local_228.field_1.intValue = uVar6;
      local_228.field_1.textValue.super_StringPtr.content.size_ = uVar8;
      local_228.field_1._16_4_ = uVar7;
      local_1e0 = (ArrayPtr<const_char>)
                  PointerReader::getBlob<capnp::Text>((PointerReader *)&local_228,(void *)0x0,0);
      kj::_::Debug::log<char_const(&)[57],char_const(&)[7],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x140,ERROR,
                 "\"failed: expected \" \"(\\\"u2f0s1\\\") == (w->getProto().getName())\", \"u2f0s1\", w->getProto().getName()"
                 ,(char (*) [57])"failed: expected (\"u2f0s1\") == (w->getProto().getName())",
                 (char (*) [7])"u2f0s1",(Reader *)&local_1e0);
    }
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[17]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x140,ERROR,"\"Maybe was empty.\"",(char (*) [17])"Maybe was empty.");
  }
  name_17.content.size_ = 7;
  name_17.content.ptr = "u2f0s1";
  DynamicStruct::Builder::get((Builder *)&local_228,(Builder *)&local_1c8,name_17);
  BVar3 = DynamicValue::Builder::AsImpl<bool,_(capnp::Kind)0>::apply((Builder *)&local_228);
  DynamicValue::Builder::~Builder((Builder *)&local_228);
  if (!BVar3 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[44]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x141,ERROR,"\"failed: expected \" \"u.get(\\\"u2f0s1\\\").as<bool>()\"",
               (char (*) [44])"failed: expected u.get(\"u2f0s1\").as<bool>()");
  }
  name_18.content.size_ = 7;
  name_18.content.ptr = "union3";
  DynamicStruct::Builder::get((Builder *)&local_228,(Builder *)local_158,name_18);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&local_1c8,(Builder *)&local_228);
  DynamicValue::Builder::~Builder((Builder *)&local_228);
  DynamicStruct::Builder::which
            ((Maybe<capnp::StructSchema::Field> *)&local_228,(Builder *)&local_1c8);
  if ((bool)(undefined1)local_228.type == true) {
    pSVar9 = (SegmentBuilder *)CONCAT44(local_228.field_1._20_4_,local_228.field_1._16_4_);
    local_228.field_1.listValue.schema.elementType._0_8_ =
         local_228.field_1.listValue.reader.capTable;
    local_228.field_1._8_8_ = local_228.field_1._40_8_;
    local_228._0_8_ = pSVar9;
    local_228.field_1.listValue.reader.segment._0_4_ =
         local_228.field_1.listValue.reader.nestingLimit;
    if (local_228.field_1.listValue.reader.structPointerCount == 0) {
      local_228.field_1.intValue = (int64_t)(WirePointer *)0x0;
      local_228.field_1.textValue.super_StringPtr.content.size_ = (size_t)(WirePointer *)0x0;
      local_228._0_8_ = (SegmentBuilder *)0x0;
      local_228.field_1._16_4_ = 0x7fffffff;
    }
    RVar11 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_228,(void *)0x0,0);
    if (((RVar11.super_StringPtr.content.size_ != 8) ||
        (*(int *)((long)RVar11.super_StringPtr.content.ptr + 3) != 0x34367330 ||
         *RVar11.super_StringPtr.content.ptr != 0x30663375)) && (kj::_::Debug::minSeverity < 3)) {
      if (local_228.field_1.listValue.reader.structPointerCount == 0) {
        local_228.field_1.listValue.reader.capTable = (CapTableReader *)(WirePointer *)0x0;
        local_228.field_1.listValue.reader.nestingLimit = 0x7fffffff;
        local_228.field_1._40_8_ = (WirePointer *)0x0;
        pSVar9 = (SegmentBuilder *)0x0;
      }
      local_228._0_8_ = pSVar9;
      local_228.field_1.intValue = (int64_t)local_228.field_1.listValue.reader.capTable;
      local_228.field_1.textValue.super_StringPtr.content.size_ = local_228.field_1._40_8_;
      local_228.field_1._16_4_ = local_228.field_1.listValue.reader.nestingLimit;
      local_1e0 = (ArrayPtr<const_char>)
                  PointerReader::getBlob<capnp::Text>((PointerReader *)&local_228,(void *)0x0,0);
      kj::_::Debug::log<char_const(&)[58],char_const(&)[8],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x145,ERROR,
                 "\"failed: expected \" \"(\\\"u3f0s64\\\") == (w->getProto().getName())\", \"u3f0s64\", w->getProto().getName()"
                 ,(char (*) [58])"failed: expected (\"u3f0s64\") == (w->getProto().getName())",
                 (char (*) [8])"u3f0s64",(Reader *)&local_1e0);
    }
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[17]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x145,ERROR,"\"Maybe was empty.\"",(char (*) [17])"Maybe was empty.");
  }
  name_19.content.size_ = 8;
  name_19.content.ptr = "u3f0s64";
  DynamicStruct::Builder::get((Builder *)&local_228,(Builder *)&local_1c8,name_19);
  iVar5 = DynamicValue::Builder::AsImpl<long,_(capnp::Kind)0>::apply((Builder *)&local_228);
  DynamicValue::Builder::~Builder((Builder *)&local_228);
  if ((iVar5 != 0x112210f47de98115) && (kj::_::Debug::minSeverity < 3)) {
    local_1e0.ptr = (char *)0x112210f47de98115;
    name_20.content.size_ = 8;
    name_20.content.ptr = "u3f0s64";
    DynamicStruct::Builder::get((Builder *)&local_228,(Builder *)&local_1c8,name_20);
    local_190 = DynamicValue::Builder::AsImpl<long,_(capnp::Kind)0>::apply((Builder *)&local_228);
    kj::_::Debug::log<char_const(&)[77],long_long,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x146,ERROR,
               "\"failed: expected \" \"(1234567890123456789ll) == (u.get(\\\"u3f0s64\\\").as<int64_t>())\", 1234567890123456789ll, u.get(\"u3f0s64\").as<int64_t>()"
               ,(char (*) [77])
                "failed: expected (1234567890123456789ll) == (u.get(\"u3f0s64\").as<int64_t>())",
               (longlong *)&local_1e0,&local_190);
    DynamicValue::Builder::~Builder((Builder *)&local_228);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_120);
  return;
}

Assistant:

TEST(DynamicApi, UnionsRead) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestUnion>();

  root.getUnion0().setU0f1s32(1234567);
  root.getUnion1().setU1f1sp("foo");
  root.getUnion2().setU2f0s1(true);
  root.getUnion3().setU3f0s64(1234567890123456789ll);

  {
    auto dynamic = toDynamic(root.asReader());
    {
      auto u = dynamic.get("union0").as<DynamicStruct>();
      EXPECT_MAYBE_EQ(w, u.which(), "u0f1s32", w->getProto().getName());
      EXPECT_EQ(1234567, u.get("u0f1s32").as<int32_t>());
    }
    {
      auto u = dynamic.get("union1").as<DynamicStruct>();
      EXPECT_MAYBE_EQ(w, u.which(), "u1f1sp", w->getProto().getName());
      EXPECT_EQ("foo", u.get("u1f1sp").as<Text>());
    }
    {
      auto u = dynamic.get("union2").as<DynamicStruct>();
      EXPECT_MAYBE_EQ(w, u.which(), "u2f0s1", w->getProto().getName());
      EXPECT_TRUE(u.get("u2f0s1").as<bool>());
    }
    {
      auto u = dynamic.get("union3").as<DynamicStruct>();
      EXPECT_MAYBE_EQ(w, u.which(), "u3f0s64", w->getProto().getName());
      EXPECT_EQ(1234567890123456789ll, u.get("u3f0s64").as<int64_t>());
    }
  }

  {
    // Again as a builder.
    auto dynamic = toDynamic(root);
    {
      auto u = dynamic.get("union0").as<DynamicStruct>();
      EXPECT_MAYBE_EQ(w, u.which(), "u0f1s32", w->getProto().getName());
      EXPECT_EQ(1234567, u.get("u0f1s32").as<int32_t>());
    }
    {
      auto u = dynamic.get("union1").as<DynamicStruct>();
      EXPECT_MAYBE_EQ(w, u.which(), "u1f1sp", w->getProto().getName());
      EXPECT_EQ("foo", u.get("u1f1sp").as<Text>());
    }
    {
      auto u = dynamic.get("union2").as<DynamicStruct>();
      EXPECT_MAYBE_EQ(w, u.which(), "u2f0s1", w->getProto().getName());
      EXPECT_TRUE(u.get("u2f0s1").as<bool>());
    }
    {
      auto u = dynamic.get("union3").as<DynamicStruct>();
      EXPECT_MAYBE_EQ(w, u.which(), "u3f0s64", w->getProto().getName());
      EXPECT_EQ(1234567890123456789ll, u.get("u3f0s64").as<int64_t>());
    }
  }
}